

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::VerifyUTF8Fallback
          (EpsCopyInputStream *this,char *ptr,size_t size)

{
  bool bVar1;
  char *local_40;
  anon_class_8_1_4e65a6d9 local_30;
  LeftoverBuffer local_28;
  LeftoverBuffer leftover;
  size_t size_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  leftover = (LeftoverBuffer)size;
  internal::anon_unknown_0::LeftoverBuffer::LeftoverBuffer(&local_28);
  local_30.leftover = &local_28;
  local_40 = AppendSize<google::protobuf::internal::EpsCopyInputStream::VerifyUTF8Fallback(char_const*,unsigned_long)::__0>
                       (this,ptr,leftover.size,&local_30);
  bVar1 = internal::anon_unknown_0::LeftoverBuffer::empty(&local_28);
  if (!bVar1) {
    local_40 = (char *)0x0;
  }
  return local_40;
}

Assistant:

const char* EpsCopyInputStream::VerifyUTF8Fallback(const char* ptr,
                                                   size_t size) {
  // Copied the implementation of CordIsValid().
  LeftoverBuffer leftover;

  ptr = AppendSize(ptr, size, [&leftover](const char* p, int s) -> bool {
    return IsViewValidUTF8WithLeftover({p, static_cast<size_t>(s)}, leftover);
  });
  return leftover.empty() ? ptr : nullptr;
}